

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

void __thiscall
chaiscript::eval::Inline_Range_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::
Inline_Range_AST_Node
          (Inline_Range_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,
          string *t_ast_node_text,Parse_Location *t_loc,
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
          *t_children)

{
  Parse_Location local_88;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string(&local_48,t_ast_node_text);
  local_88.start = t_loc->start;
  local_88.end = t_loc->end;
  local_88.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (t_loc->filename).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_88.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (t_loc->filename).
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (t_loc->filename).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (t_loc->filename).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_children->
       super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_children->
       super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_children->
       super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_children->
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_children->
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (t_children->
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::AST_Node_Impl
            (&this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,&local_48,
             Inline_Range,&local_88,&local_68);
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ::~vector(&local_68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)&PTR_get_children_006a9640;
  (this->m_loc).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

Inline_Range_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, std::vector<AST_Node_Impl_Ptr<T>> t_children)
          : AST_Node_Impl<T>(std::move(t_ast_node_text), AST_Node_Type::Inline_Range, std::move(t_loc), std::move(t_children)) {
      }